

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O0

void myutils::set_socket_nonblock(SOCKET socket,bool nonblock)

{
  undefined4 local_14;
  int flags;
  bool nonblock_local;
  SOCKET socket_local;
  
  local_14 = fcntl(socket,3,0);
  if (nonblock) {
    local_14 = local_14 | 0x800;
  }
  else {
    local_14 = local_14 & 0xfffff7ff;
  }
  fcntl(socket,4,(ulong)local_14);
  return;
}

Assistant:

void set_socket_nonblock(SOCKET socket, bool nonblock)
    {
    #ifdef _WIN32
        unsigned long nNonBlocking = nonblock ? 1 : 0;
        if (ioctlsocket(socket, FIONBIO, &nNonBlocking) == SOCKET_ERROR)
            assert(false);
    #else
        int flags = fcntl(socket, F_GETFL, 0);
	if (nonblock)
            flags |= O_NONBLOCK;
        else
            flags &= ~O_NONBLOCK;  
        fcntl(socket, F_SETFL, flags);
    #endif
    }